

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::internal::DataSourceInstanceThreadLocalState::Reset
          (DataSourceInstanceThreadLocalState *this)

{
  DataSourceInstanceThreadLocalState *this_local;
  
  std::unique_ptr<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>::reset
            ((unique_ptr<perfetto::TraceWriterBase,_std::default_delete<perfetto::TraceWriterBase>_>
              *)this,(pointer)0x0);
  ::std::unique_ptr<void,_void_(*)(void_*)>::reset(&this->incremental_state,(pointer)0x0);
  ::std::unique_ptr<void,_void_(*)(void_*)>::reset(&this->data_source_custom_tls,(pointer)0x0);
  this->muxer_id_for_testing = 0;
  this->backend_id = 0;
  this->backend_connection_id = 0;
  this->buffer_id = 0;
  this->data_source_instance_id = 0;
  this->incremental_state_generation = 0;
  this->is_intercepted = false;
  return;
}

Assistant:

void Reset() {
    trace_writer.reset();
    incremental_state.reset();
    data_source_custom_tls.reset();
    muxer_id_for_testing = 0;
    backend_id = 0;
    backend_connection_id = 0;
    buffer_id = 0;
    data_source_instance_id = 0;
    incremental_state_generation = 0;
    is_intercepted = false;
  }